

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O2

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_ExceptionThrow_Test::Body
          (iu_SyntaxTest_x_iutest_x_ExceptionThrow_Test *this)

{
  undefined8 extraout_RAX;
  Fixed *fixed;
  undefined8 extraout_RAX_00;
  int extraout_EDX;
  iuCodeMessage iStack_1c8;
  Fixed local_198;
  
  ExceptionFunction(2);
  __cxa_begin_catch(extraout_RAX);
  __cxa_end_catch();
  if (extraout_EDX != 2) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    fixed = iutest::AssertionHelper::Fixed::operator<<(&local_198,2);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&iStack_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
               ,0x34e,
               "\nExpected: ExceptionFunction(x) throws an exception of type ::std::bad_exception.\n  Actual: it throws a different type."
              );
    iStack_1c8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&iStack_1c8,fixed);
    std::__cxx11::string::~string((string *)&iStack_1c8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    return;
  }
  ExceptionFunction(2);
  std::__cxx11::string::~string((string *)&iStack_1c8);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_198);
  _Unwind_Resume(extraout_RAX_00);
}

Assistant:

IUTEST(SyntaxTest, ExceptionThrow)
{
    if( int x = 2 )
        IUTEST_ASSERT_THROW(ExceptionFunction(x), ::std::bad_exception) << x;
    if( int x = 2 )
        IUTEST_EXPECT_THROW(ExceptionFunction(x), ::std::bad_exception) << x;
    if( int x = 2 )
        IUTEST_INFORM_THROW(ExceptionFunction(x), ::std::bad_exception) << x;
    if( int x = 2 )
        IUTEST_ASSUME_THROW(ExceptionFunction(x), ::std::bad_exception) << x;
}